

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_31::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  Promise<void> *promise;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  HttpOutputStream local_80;
  Fault local_60;
  Fault f;
  ArrayPtr<const_unsigned_char> *piece;
  ArrayPtr<const_unsigned_char> *__end2;
  ArrayPtr<const_unsigned_char> *__begin2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *__range2;
  uint64_t size;
  HttpFixedLengthEntityWriter *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  promise = (Promise<void> *)CONCAT44(in_register_00000034,__fd);
  __range2 = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)0x0;
  this_local = (HttpFixedLengthEntityWriter *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  __end2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::begin
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  pAVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::end
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  for (; __end2 != pAVar1; __end2 = __end2 + 1) {
    sVar2 = ArrayPtr<const_unsigned_char>::size(__end2);
    __range2 = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)((long)&__range2->ptr + sVar2);
  }
  if (__range2 == (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)0x0) {
    Promise<void>::Promise((Promise<void> *)this);
  }
  else {
    if ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)
        promise[1].super_PromiseBase.node.disposer < __range2) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
                (&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x72b,FAILED,"size <= length","\"overwrote Content-Length\"",
                 (char (*) [25])"overwrote Content-Length");
      _::Debug::Fault::fatal(&local_60);
    }
    promise[1].super_PromiseBase.node.disposer =
         (Disposer *)((long)promise[1].super_PromiseBase.node.disposer - (long)__range2);
    pieces.size_ = (size_t)this_local;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)(promise->super_PromiseBase).node.ptr;
    HttpOutputStream::writeBodyData(&local_80,pieces);
    maybeFinishAfter(this,promise);
    Promise<void>::~Promise((Promise<void> *)&local_80);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) return kj::READY_NOW;
    KJ_REQUIRE(size <= length, "overwrote Content-Length");
    length -= size;

    return maybeFinishAfter(inner.writeBodyData(pieces));
  }